

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O2

socket_target * new_socket_target(char *dest,size_t dest_len,char *source,size_t source_len)

{
  uint uVar1;
  socket_target *target;
  socket_target *psVar2;
  
  target = (socket_target *)alloc_mem(0xe8);
  if (target != (socket_target *)0x0) {
    (target->target_addr).sun_family = 1;
    memcpy((target->target_addr).sun_path,dest,dest_len);
    (target->target_addr).sun_path[dest_len] = '\0';
    (target->local_addr).sun_family = 1;
    memcpy((target->local_addr).sun_path,source,source_len);
    (target->local_addr).sun_path[source_len] = '\0';
    target->target_addr_len = 0x6e;
    target->local_socket = -1;
    uVar1 = stumpless_get_default_options();
    if ((uVar1 & 4) != 0) {
      return target;
    }
    psVar2 = open_bind_socket(target);
    if (psVar2 != (socket_target *)0x0) {
      return target;
    }
    free_mem(target);
  }
  return (socket_target *)0x0;
}

Assistant:

struct socket_target *
new_socket_target( const char *dest,
                   size_t dest_len,
                   const char *source,
                   size_t source_len ) {
  struct socket_target *target;
  struct socket_target *open_result;
  int options;

  target = alloc_mem( sizeof( *target ) );
  if( !target ) {
    goto fail;
  }

  target->target_addr.sun_family = AF_UNIX;
  memcpy( &target->target_addr.sun_path, dest, dest_len );
  target->target_addr.sun_path[dest_len] = '\0';

  target->local_addr.sun_family = AF_UNIX;
  memcpy( &target->local_addr.sun_path, source, source_len );
  target->local_addr.sun_path[source_len] = '\0';

  target->target_addr_len = sizeof( target->target_addr );
  target->local_socket = -1;

  options = stumpless_get_default_options(  );
  if ( !( options & STUMPLESS_OPTION_ODELAY ) ) {
    open_result = open_bind_socket( target );
    if ( !open_result ) {
      goto fail_open;
    }
  }

  return target;

fail_open:
  free_mem( target );  
fail:
  return NULL;
}